

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O2

int aom_uleb_encode(uint64_t value,size_t available,uint8_t *coded_value,size_t *coded_size)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  
  sVar3 = aom_uleb_size_in_bytes(value);
  iVar4 = -1;
  if ((((sVar3 < 9 && value >> 0x20 == 0) && (coded_size != (size_t *)0x0)) &&
      (coded_value != (uint8_t *)0x0)) && (sVar3 <= available)) {
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      bVar1 = 0x7f < value;
      bVar2 = (byte)value;
      value = value >> 7;
      coded_value[sVar5] = bVar1 << 7 | bVar2 & 0x7f;
    }
    *coded_size = sVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int aom_uleb_encode(uint64_t value, size_t available, uint8_t *coded_value,
                    size_t *coded_size) {
  const size_t leb_size = aom_uleb_size_in_bytes(value);
  if (value > kMaximumLeb128Value || leb_size > kMaximumLeb128Size ||
      leb_size > available || !coded_value || !coded_size) {
    return -1;
  }

  for (size_t i = 0; i < leb_size; ++i) {
    uint8_t byte = value & 0x7f;
    value >>= 7;

    if (value != 0) byte |= 0x80;  // Signal that more bytes follow.

    *(coded_value + i) = byte;
  }

  *coded_size = leb_size;
  return 0;
}